

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_write_pubkey(mbedtls_rsa_context *rsa,uchar *start,uchar **p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong len;
  mbedtls_mpi T;
  mbedtls_mpi local_40;
  
  mbedtls_mpi_init(&local_40);
  len = 0;
  iVar1 = mbedtls_rsa_export(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                             (mbedtls_mpi *)0x0,&local_40);
  if (iVar1 == 0) {
    uVar3 = mbedtls_asn1_write_mpi(p,start,&local_40);
    len = (ulong)uVar3;
    if ((int)uVar3 < 0) {
      mbedtls_mpi_free(&local_40);
      return uVar3;
    }
    iVar1 = mbedtls_rsa_export(rsa,&local_40,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                               (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
    if (iVar1 == 0) {
      iVar1 = mbedtls_asn1_write_mpi(p,start,&local_40);
      iVar2 = 0;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      len = (ulong)(iVar2 + uVar3);
    }
  }
  mbedtls_mpi_free(&local_40);
  if (-1 < iVar1) {
    iVar2 = mbedtls_asn1_write_len(p,start,len);
    iVar1 = iVar2;
    if ((-1 < iVar2) && (iVar1 = mbedtls_asn1_write_tag(p,start,'0'), -1 < iVar1)) {
      iVar1 = iVar2 + (int)len + iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_write_pubkey(const mbedtls_rsa_context *rsa, unsigned char *start,
                             unsigned char **p)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;
    mbedtls_mpi T;

    mbedtls_mpi_init(&T);

    /* Export E */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, NULL, NULL, &T)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export N */
    if ((ret = mbedtls_rsa_export(rsa, &T, NULL, NULL, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

end_of_export:

    mbedtls_mpi_free(&T);
    if (ret < 0) {
        return ret;
    }

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_len(p, start, len));
    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_tag(p, start, MBEDTLS_ASN1_CONSTRUCTED |
                                                     MBEDTLS_ASN1_SEQUENCE));

    return (int) len;
}